

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall Js::LocalsWalker::GetLocal(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Type *ppVVar6;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar7;
  
  iVar4 = 0;
  iVar7 = iVar4;
  if (((this->pVarWalkers !=
        (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) &&
      (iVar7 = 0,
      (this->pVarWalkers->
      super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count
      != 0)) &&
     (this_00 = this->pVarWalkers,
     0 < (this_00->
         super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
         count)) {
    iVar7 = 0;
    do {
      ppVVar6 = JsUtil::
                List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar7);
      pVVar1 = *ppVVar6;
      if ((this->frameWalkerFlags & 1) == 0) {
LAB_008c0a86:
        iVar3 = (*(pVVar1->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])
                          (pVVar1);
        if (i < iVar3) {
          iVar4 = (**(pVVar1->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase)
                            (pVVar1,(ulong)(uint)i,pResolvedObject);
          iVar5 = 1;
          bVar2 = false;
        }
        else {
          iVar5 = 0;
          bVar2 = true;
          i = i - iVar3;
        }
      }
      else {
        iVar5 = 2;
        bVar2 = false;
        if ((pVVar1->groupType < (UIGroupType_Param|UIGroupType_InnerScope)) &&
           ((0x13U >> (pVVar1->groupType & 0x1f) & 1) != 0)) goto LAB_008c0a86;
      }
      if (!bVar2) goto LAB_008c0acd;
      iVar7 = iVar7 + 1;
      this_00 = this->pVarWalkers;
    } while (iVar7 < (this_00->
                     super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
    iVar5 = 2;
LAB_008c0acd:
    iVar7 = iVar4;
    if (iVar5 == 2) {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

BOOL LocalsWalker::GetLocal(int i, ResolvedObject* pResolvedObject)
    {
        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);

            if (!ShouldMakeGroups() || !variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i -= count;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        return FALSE;
    }